

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ap.c
# Opt level: O0

int init_config_path(AP_CTX *ctx)

{
  bool bVar1;
  size_t sVar2;
  char *pcVar3;
  BOOL allocated_in_this_function;
  size_t size;
  int rc;
  AP_CTX *ctx_local;
  
  size._4_4_ = 0;
  bVar1 = false;
  if ((ctx->config_path == (char *)0x0) &&
     ((ctx->default_dir != (char *)0x0 ||
      ((size._4_4_ = get_default_directory(ctx), size._4_4_ == 0 &&
       (size._4_4_ = create_directory(ctx->default_dir), size._4_4_ == 0)))))) {
    bVar1 = true;
    sVar2 = strlen(ctx->default_dir);
    sVar2 = sVar2 + 0x12;
    pcVar3 = (char *)calloc(1,sVar2);
    ctx->config_path = pcVar3;
    if (ctx->config_path == (char *)0x0) {
      ap_log(AP_LOG_LEVEL_ERROR,"(%s) Can not allocate memory for \'ctx->config_path\'\n",
             ctx->client_ip);
      size._4_4_ = 4;
    }
    else {
      ap_str_strlcpy(ctx->config_path,ctx->default_dir,sVar2);
      ap_str_strlcat(ctx->config_path,"/",sVar2);
      ap_str_strlcat(ctx->config_path,"authprogs.conf",sVar2);
    }
  }
  if (((size._4_4_ != 0) && (bVar1)) && (ctx->config_path != (char *)0x0)) {
    free(ctx->config_path);
  }
  return size._4_4_;
}

Assistant:

static int init_config_path (AP_CTX *ctx)
{
	int				rc								= AP_NO_ERROR;
	size_t			size;
	BOOL			allocated_in_this_function		= FALSE;
	
	if (ctx->config_path == NULL)
	{
		if (ctx->default_dir == NULL)
		{
			rc = get_default_directory (ctx);
			if (rc != AP_NO_ERROR)
			{
				goto finish;
			}

			rc = create_directory (ctx->default_dir);
			if (rc != AP_NO_ERROR)
			{
				goto finish;
			}
		}

		allocated_in_this_function = TRUE;

		size = strlen (ctx->default_dir) + sizeof ("/") + sizeof (AP_DEFAULT_CONFIG_FILENAME) + 1;

		ctx->config_path = (char *) calloc (1, size);
		if (ctx->config_path == NULL)
		{
			ap_error ("(%s) Can not allocate memory for 'ctx->config_path'\n", ctx->client_ip);
			rc = AP_ERROR_NO_MEMORY;

			goto finish;
		}

		ap_str_strlcpy (ctx->config_path, ctx->default_dir, size);
		ap_str_strlcat (ctx->config_path, "/", size);
		ap_str_strlcat (ctx->config_path, AP_DEFAULT_CONFIG_FILENAME, size);
	}

finish:
	if (rc != AP_NO_ERROR)
	{
		if (allocated_in_this_function == TRUE)
		{
			if (ctx->config_path != NULL)
			{
				free (ctx->config_path);
			}
		}
	}

	return rc;
}